

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O1

void __thiscall
duckdb::HistogramBinState<int>::InitializeBins<duckdb::HistogramFunctor>
          (HistogramBinState<int> *this,Vector *bin_vector,idx_t count,idx_t pos,
          AggregateInputData *aggr_input)

{
  pointer __src;
  int iVar1;
  size_type __n;
  long lVar2;
  vector<int,_std::allocator<int>_> *this_00;
  iterator __position;
  unsafe_vector<int> *puVar3;
  unsafe_vector<idx_t> *puVar4;
  ulong uVar5;
  UnifiedVectorFormat *pUVar6;
  pointer piVar7;
  BinderException *pBVar8;
  pointer piVar9;
  size_type sVar10;
  ulong uVar11;
  pointer *ppiVar12;
  UnifiedVectorFormat bin_child_data;
  UnifiedVectorFormat bin_data;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  puVar3 = (unsafe_vector<int> *)operator_new(0x18);
  (puVar3->super_vector<int,_std::allocator<int>_>).super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (puVar3->super_vector<int,_std::allocator<int>_>).super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (puVar3->super_vector<int,_std::allocator<int>_>).super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->bin_boundaries = puVar3;
  puVar4 = (unsafe_vector<idx_t> *)operator_new(0x18);
  (puVar4->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (puVar4->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (puVar4->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->counts = puVar4;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)bin_vector,(UnifiedVectorFormat *)count);
  if (*local_78 != 0) {
    pos = (idx_t)*(uint *)(*local_78 + pos * 4);
  }
  uVar11 = *(ulong *)(local_70 + pos * 0x10);
  __n = *(size_type *)(local_70 + 8 + pos * 0x10);
  if ((local_68 != 0) && ((*(ulong *)(local_68 + (pos >> 6) * 8) >> (pos & 0x3f) & 1) == 0)) {
    pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
    local_c0 = local_b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"Histogram bin list cannot be NULL","");
    duckdb::BinderException::BinderException(pBVar8,(string *)&local_c0);
    __cxa_throw(pBVar8,&BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar5 = duckdb::ListVector::GetEntry(bin_vector);
  pUVar6 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(bin_vector);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  duckdb::Vector::ToUnifiedFormat(uVar5,pUVar6);
  std::vector<int,_std::allocator<int>_>::reserve
            (&this->bin_boundaries->super_vector<int,_std::allocator<int>_>,__n);
  if (__n != 0) {
    sVar10 = __n;
    do {
      lVar2 = *local_c0;
      uVar5 = uVar11;
      if (lVar2 != 0) {
        uVar5 = (ulong)*(uint *)(lVar2 + uVar11 * 4);
      }
      if (local_b0[0] != 0) {
        if ((*(ulong *)(local_b0[0] + (uVar5 >> 6) * 8) >> (uVar5 & 0x3f) & 1) == 0) {
          pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
          local_e0[0] = local_d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_e0,"Histogram bin entry cannot be NULL","");
          duckdb::BinderException::BinderException(pBVar8,(string *)local_e0);
          __cxa_throw(pBVar8,&BinderException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      uVar5 = uVar11;
      if (lVar2 != 0) {
        uVar5 = (ulong)*(uint *)(lVar2 + uVar11 * 4);
      }
      this_00 = &this->bin_boundaries->super_vector<int,_std::allocator<int>_>;
      iVar1 = *(int *)(local_b8 + uVar5 * 4);
      local_e0[0] = (undefined1 *)CONCAT44(local_e0[0]._4_4_,iVar1);
      __position._M_current =
           (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (this_00,__position,(int *)local_e0);
      }
      else {
        *__position._M_current = iVar1;
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      uVar11 = uVar11 + 1;
      sVar10 = sVar10 - 1;
    } while (sVar10 != 0);
  }
  piVar7 = (this->bin_boundaries->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar9 = (this->bin_boundaries->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (piVar7 != piVar9) {
    uVar11 = (long)piVar9 - (long)piVar7 >> 2;
    lVar2 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar7,piVar9,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar7,piVar9);
  }
  puVar3 = this->bin_boundaries;
  piVar7 = (puVar3->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar9 = (puVar3->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (4 < (ulong)((long)piVar9 - (long)piVar7)) {
    uVar11 = 1;
    do {
      ppiVar12 = &(puVar3->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish;
      if (piVar7[uVar11 + 0xffffffffffffffff] == piVar7[uVar11]) {
        __src = piVar7 + uVar11 + 1;
        if (__src != piVar9) {
          memmove(piVar7 + uVar11,__src,(long)piVar9 - (long)__src);
        }
        uVar11 = uVar11 - 1;
        *ppiVar12 = *ppiVar12 + -1;
      }
      uVar11 = uVar11 + 1;
      puVar3 = this->bin_boundaries;
      piVar7 = (puVar3->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar9 = (puVar3->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
    } while (uVar11 < (ulong)((long)piVar9 - (long)piVar7 >> 2));
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,__n + 1);
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

void InitializeBins(Vector &bin_vector, idx_t count, idx_t pos, AggregateInputData &aggr_input) {
		bin_boundaries = new unsafe_vector<T>();
		counts = new unsafe_vector<idx_t>();
		UnifiedVectorFormat bin_data;
		bin_vector.ToUnifiedFormat(count, bin_data);
		auto bin_counts = UnifiedVectorFormat::GetData<list_entry_t>(bin_data);
		auto bin_index = bin_data.sel->get_index(pos);
		auto bin_list = bin_counts[bin_index];
		if (!bin_data.validity.RowIsValid(bin_index)) {
			throw BinderException("Histogram bin list cannot be NULL");
		}

		auto &bin_child = ListVector::GetEntry(bin_vector);
		auto bin_count = ListVector::GetListSize(bin_vector);
		UnifiedVectorFormat bin_child_data;
		auto extra_state = OP::CreateExtraState(bin_count);
		OP::PrepareData(bin_child, bin_count, extra_state, bin_child_data);

		bin_boundaries->reserve(bin_list.length);
		for (idx_t i = 0; i < bin_list.length; i++) {
			auto bin_child_idx = bin_child_data.sel->get_index(bin_list.offset + i);
			if (!bin_child_data.validity.RowIsValid(bin_child_idx)) {
				throw BinderException("Histogram bin entry cannot be NULL");
			}
			bin_boundaries->push_back(OP::template ExtractValue<T>(bin_child_data, bin_list.offset + i, aggr_input));
		}
		// sort the bin boundaries
		std::sort(bin_boundaries->begin(), bin_boundaries->end());
		// ensure there are no duplicate bin boundaries
		for (idx_t i = 1; i < bin_boundaries->size(); i++) {
			if (Equals::Operation((*bin_boundaries)[i - 1], (*bin_boundaries)[i])) {
				bin_boundaries->erase_at(i);
				i--;
			}
		}

		counts->resize(bin_list.length + 1);
	}